

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.cpp
# Opt level: O2

DOMElement * __thiscall
xercesc_4_0::SchemaInfo::getTopLevelComponent
          (SchemaInfo *this,unsigned_short compCategory,XMLCh *compName,XMLCh *name,
          SchemaInfo **enclosingSchema)

{
  DOMElement *pDVar1;
  SchemaInfo *this_00;
  XMLSize_t i;
  XMLSize_t getAt;
  XMLSize_t XVar2;
  
  if (this->fSchemaRootElement == (DOMElement *)0x0) {
    return (DOMElement *)0x0;
  }
  pDVar1 = getTopLevelComponent(this,compCategory,compName,name);
  if (pDVar1 == (DOMElement *)0x0) {
    if (this->fIncludeInfoList == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      XVar2 = 0;
    }
    else {
      XVar2 = (this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
    }
    for (getAt = 0; pDVar1 = (DOMElement *)0x0, XVar2 != getAt; getAt = getAt + 1) {
      this_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                          (&this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,
                           getAt);
      if ((this_00 != this) &&
         (pDVar1 = getTopLevelComponent(this_00,compCategory,compName,name),
         pDVar1 != (DOMElement *)0x0)) {
        *enclosingSchema = this_00;
        return pDVar1;
      }
    }
  }
  return pDVar1;
}

Assistant:

DOMElement*
SchemaInfo::getTopLevelComponent(const unsigned short compCategory,
                                 const XMLCh* const compName,
                                 const XMLCh* const name,
                                 SchemaInfo** enclosingSchema) {

    if (fSchemaRootElement == 0)
      return 0;

    SchemaInfo* currentInfo = this;
    DOMElement* child = getTopLevelComponent(compCategory, compName, name);

    if (child == 0) {

        XMLSize_t listSize = (fIncludeInfoList) ? fIncludeInfoList->size() : 0;

        for (XMLSize_t i=0; i < listSize; i++) {

            currentInfo = fIncludeInfoList->elementAt(i);

            if (currentInfo == this)
                continue;

            child = currentInfo->getTopLevelComponent(compCategory, compName, name);

            if (child != 0) {

                *enclosingSchema = currentInfo;
                break;
            }
        }
    }

    return child;
}